

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkPipelineStageFlags Diligent::ResourceStateFlagToVkPipelineStage(RESOURCE_STATE StateFlag)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  RESOURCE_STATE StateFlag_local;
  
  msg.field_2._8_4_ = StateFlag;
  if ((StateFlag & StateFlag - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[28]>((string *)local_30,(char (*) [28])"Only single bit must be set");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ResourceStateFlagToVkPipelineStage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x4c0);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (msg.field_2._8_4_ == 1) {
    msg.field_2._12_4_ = 1;
  }
  else if (msg.field_2._8_4_ == 2) {
    msg.field_2._12_4_ = 4;
  }
  else if (msg.field_2._8_4_ == 4) {
    msg.field_2._12_4_ = 0x3808f8;
  }
  else if (msg.field_2._8_4_ == 8) {
    msg.field_2._12_4_ = 4;
  }
  else if (msg.field_2._8_4_ == 0x10) {
    msg.field_2._12_4_ = 0x400;
  }
  else if (msg.field_2._8_4_ == 0x20) {
    msg.field_2._12_4_ = 0x3808f8;
  }
  else if (msg.field_2._8_4_ == 0x40) {
    msg.field_2._12_4_ = 0x300;
  }
  else if (msg.field_2._8_4_ == 0x80) {
    msg.field_2._12_4_ = 0x300;
  }
  else if (msg.field_2._8_4_ == 0x100) {
    msg.field_2._12_4_ = 0x3808f8;
  }
  else if (msg.field_2._8_4_ == 0x200) {
    msg.field_2._12_4_ = 0;
  }
  else if (msg.field_2._8_4_ == 0x400) {
    msg.field_2._12_4_ = 2;
  }
  else if (msg.field_2._8_4_ == 0x800) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (msg.field_2._8_4_ == 0x1000) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (msg.field_2._8_4_ == 0x2000) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (msg.field_2._8_4_ == 0x4000) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (msg.field_2._8_4_ == 0x8000) {
    msg.field_2._12_4_ = 0x80;
  }
  else if (msg.field_2._8_4_ == 0x10000) {
    msg.field_2._12_4_ = 0x2000;
  }
  else if (msg.field_2._8_4_ == 0x20000) {
    msg.field_2._12_4_ = 0x2000000;
  }
  else if (msg.field_2._8_4_ == 0x40000) {
    msg.field_2._12_4_ = 0x2000000;
  }
  else if (msg.field_2._8_4_ == 0x80000) {
    msg.field_2._12_4_ = 0x200000;
  }
  else if (msg.field_2._8_4_ == 0x100000) {
    msg.field_2._12_4_ = 0x10000;
  }
  else if (msg.field_2._8_4_ == 0x200000) {
    msg.field_2._12_4_ = 0xc00000;
  }
  else {
    FormatString<char[31]>((string *)local_60,(char (*) [31])"Unexpected resource state flag");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ResourceStateFlagToVkPipelineStage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x4dd);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 0;
  }
  return msg.field_2._12_4_;
}

Assistant:

static VkPipelineStageFlags ResourceStateFlagToVkPipelineStage(RESOURCE_STATE StateFlag)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "This function must be updated to handle new resource state flag");
    VERIFY((StateFlag & (StateFlag - 1)) == 0, "Only single bit must be set");
    switch (StateFlag)
    {
        // clang-format off
        case RESOURCE_STATE_UNDEFINED:         return VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;
        case RESOURCE_STATE_VERTEX_BUFFER:     return VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
        case RESOURCE_STATE_CONSTANT_BUFFER:   return VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
        case RESOURCE_STATE_INDEX_BUFFER:      return VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
        case RESOURCE_STATE_RENDER_TARGET:     return VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
        case RESOURCE_STATE_UNORDERED_ACCESS:  return VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
        case RESOURCE_STATE_DEPTH_WRITE:       return VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT | VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT;
        case RESOURCE_STATE_DEPTH_READ:        return VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT | VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT;
        case RESOURCE_STATE_SHADER_RESOURCE:   return VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
        case RESOURCE_STATE_STREAM_OUT:        return 0;
        case RESOURCE_STATE_INDIRECT_ARGUMENT: return VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT;
        case RESOURCE_STATE_COPY_DEST:         return VK_PIPELINE_STAGE_TRANSFER_BIT;
        case RESOURCE_STATE_COPY_SOURCE:       return VK_PIPELINE_STAGE_TRANSFER_BIT;
        case RESOURCE_STATE_RESOLVE_DEST:      return VK_PIPELINE_STAGE_TRANSFER_BIT;
        case RESOURCE_STATE_RESOLVE_SOURCE:    return VK_PIPELINE_STAGE_TRANSFER_BIT;
        case RESOURCE_STATE_INPUT_ATTACHMENT:  return VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT;
        case RESOURCE_STATE_PRESENT:           return VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT;
        case RESOURCE_STATE_BUILD_AS_READ:     return VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR;
        case RESOURCE_STATE_BUILD_AS_WRITE:    return VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR;
        case RESOURCE_STATE_RAY_TRACING:       return VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR;
        case RESOURCE_STATE_COMMON:            return VK_PIPELINE_STAGE_ALL_COMMANDS_BIT; // resource may be used in multiple states
        case RESOURCE_STATE_SHADING_RATE:      return VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT | VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
            // clang-format on

        default:
            UNEXPECTED("Unexpected resource state flag");
            return 0;
    }
}